

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

void __thiscall pg::Game::write_dot(Game *this,ostream *out)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  int *local_28;
  int *curedge;
  int i;
  ostream *out_local;
  Game *this_local;
  
  poVar2 = std::operator<<(out,"digraph G {");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  for (curedge._4_4_ = 0; (long)curedge._4_4_ < this->n_vertices; curedge._4_4_ = curedge._4_4_ + 1)
  {
    poVar2 = (ostream *)std::ostream::operator<<(out,curedge._4_4_);
    poVar2 = std::operator<<(poVar2," [ shape=\"");
    iVar1 = owner(this,curedge._4_4_);
    pcVar3 = "diamond";
    if (iVar1 != 0) {
      pcVar3 = "box";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,"\", label=\"");
    iVar1 = priority(this,curedge._4_4_);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,"\"];");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    for (local_28 = outs(this,curedge._4_4_); *local_28 != -1; local_28 = local_28 + 1) {
      poVar2 = (ostream *)std::ostream::operator<<(out,curedge._4_4_);
      poVar2 = std::operator<<(poVar2," -> ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_28);
      poVar2 = std::operator<<(poVar2,";");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  poVar2 = std::operator<<(out,"}");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
Game::write_dot(std::ostream &out)
{
    out << "digraph G {" << std::endl;
    for (int i=0; i<n_vertices; i++) {
        out << i << " [ shape=\"" << (owner(i) ? "box" : "diamond")
            << "\", label=\"" << priority(i) << "\"];" << std::endl;
        for (auto curedge = outs(i); *curedge != -1; curedge++) {
            out << i << " -> " << (*curedge) << ";" << std::endl;
        }
    }
    out << "}" << std::endl;
}